

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.h
# Opt level: O3

proxy * __thiscall
YAML::detail::iterator_base<YAML::detail::iterator_value>::operator->
          (proxy *__return_storage_ptr__,iterator_base<YAML::detail::iterator_value> *this)

{
  value_type local_d0;
  
  operator*(&local_d0,this);
  proxy::proxy(__return_storage_ptr__,&local_d0);
  if (local_d0.super_pair<YAML::Node,_YAML::Node>.second.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super_pair<YAML::Node,_YAML::Node>.second.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.super_pair<YAML::Node,_YAML::Node>.second.m_invalidKey._M_dataplus._M_p !=
      &local_d0.super_pair<YAML::Node,_YAML::Node>.second.m_invalidKey.field_2) {
    operator_delete(local_d0.super_pair<YAML::Node,_YAML::Node>.second.m_invalidKey._M_dataplus._M_p
                   );
  }
  if (local_d0.super_pair<YAML::Node,_YAML::Node>.first.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super_pair<YAML::Node,_YAML::Node>.first.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.super_pair<YAML::Node,_YAML::Node>.first.m_invalidKey._M_dataplus._M_p !=
      &local_d0.super_pair<YAML::Node,_YAML::Node>.first.m_invalidKey.field_2) {
    operator_delete(local_d0.super_pair<YAML::Node,_YAML::Node>.first.m_invalidKey._M_dataplus._M_p)
    ;
  }
  if (local_d0.super_Node.m_pMemory.
      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super_Node.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.super_Node.m_invalidKey._M_dataplus._M_p !=
      &local_d0.super_Node.m_invalidKey.field_2) {
    operator_delete(local_d0.super_Node.m_invalidKey._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

proxy operator->() const { return proxy(**this); }